

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * __thiscall wasm::operator<<(wasm *this,ostream *os,Signature sig)

{
  ostream *poVar1;
  TypePrinter local_b0;
  undefined1 local_28 [8];
  Signature sig_local;
  
  sig_local.params = sig.params.id;
  local_28 = (undefined1  [8])os;
  anon_unknown_0::TypePrinter::TypePrinter(&local_b0,(ostream *)this);
  poVar1 = anon_unknown_0::TypePrinter::print(&local_b0,(Signature *)local_28);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_b0);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Signature sig) {
  return TypePrinter(os).print(sig);
}